

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::TracingServiceImpl::EmitSeizedForBugreportLifecycleEvent
          (TracingServiceImpl *this,
          vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *packets)

{
  RootMessage<perfetto::protos::pbzero::TracePacket> *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> packet_00;
  TimeNanos value;
  Message *this_01;
  HeapBuffered<perfetto::protos::pbzero::TracePacket> packet;
  undefined8 in_stack_ffffffffffffff08;
  vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *in_stack_ffffffffffffff10;
  pointer in_stack_ffffffffffffff18;
  pointer local_e0;
  HeapBuffered<perfetto::protos::pbzero::TracePacket> local_d8;
  
  protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::HeapBuffered
            (&local_d8,0x1000,0x1000);
  value = base::GetBootTimeNs();
  this_00 = &local_d8.msg_;
  protozero::Message::AppendVarInt<unsigned_long>((Message *)this_00,8,value.__r);
  protozero::Message::AppendVarInt<int>((Message *)this_00,3,this->uid_);
  protozero::Message::AppendVarInt<unsigned_int>((Message *)this_00,10,1);
  this_01 = protozero::Message::BeginNestedMessageInternal((Message *)this_00,0x45);
  protozero::Message::AppendVarInt<int>(this_01,6,1);
  protozero::Message::Finalize((Message *)this_00);
  protozero::ScatteredHeapBuffer::StitchSlices
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffff10,
             &local_d8.shb_);
  packet_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffff10;
  packet_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff08;
  packet_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffff18;
  anon_unknown_4::SerializeAndAppendPacket
            ((anon_unknown_4 *)packets,in_stack_ffffffffffffff10,packet_00);
  if (in_stack_ffffffffffffff10 !=
      (vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *)0x0) {
    operator_delete(in_stack_ffffffffffffff10,(long)local_e0 - (long)in_stack_ffffffffffffff10);
  }
  protozero::MessageArena::~MessageArena(&local_d8.msg_.root_arena_);
  protozero::ScatteredStreamWriter::~ScatteredStreamWriter(&local_d8.writer_);
  protozero::ScatteredHeapBuffer::~ScatteredHeapBuffer(&local_d8.shb_);
  return;
}

Assistant:

void TracingServiceImpl::EmitSeizedForBugreportLifecycleEvent(
    std::vector<TracePacket>* packets) {
  protozero::HeapBuffered<protos::pbzero::TracePacket> packet;
  packet->set_timestamp(static_cast<uint64_t>(base::GetBootTimeNs().count()));
  packet->set_trusted_uid(static_cast<int32_t>(uid_));
  packet->set_trusted_packet_sequence_id(kServicePacketSequenceID);
  auto* service_event = packet->set_service_event();
  service_event->AppendVarInt(
      protos::pbzero::TracingServiceEvent::kSeizedForBugreportFieldNumber, 1);
  SerializeAndAppendPacket(packets, packet.SerializeAsArray());
}